

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O1

bool __thiscall Rml::ElementScroll::CreateScrollbar(ElementScroll *this,Orientation orientation)

{
  WidgetScroll *this_00;
  Element *pEVar1;
  pointer *__ptr;
  char *pcVar2;
  Element **ppEVar3;
  pointer __p;
  ElementPtr scrollbar_element;
  Element *local_c8;
  _Head_base<0UL,_Rml::Element_*,_false> local_c0;
  undefined1 local_b8 [40];
  undefined8 local_90;
  PropertyDefinition *local_88;
  int local_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  String local_68;
  XMLAttributes local_48;
  
  ppEVar3 = &this->scrollbars[orientation].element;
  if ((*ppEVar3 == (Element *)0x0) ||
     (this->scrollbars[orientation].widget._M_t.
      super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>._M_t.
      super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>.
      super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl == (WidgetScroll *)0x0)) {
    pEVar1 = this->element;
    local_b8._0_8_ = local_b8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"*","");
    pcVar2 = "scrollbarhorizontal";
    if (orientation == VERTICAL) {
      pcVar2 = "scrollbarvertical";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar2,pcVar2 + (ulong)(orientation != VERTICAL) * 2 + 0x11);
    local_48.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Factory::InstanceElement((Factory *)&local_c8,pEVar1,(String *)local_b8,&local_68,&local_48);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_48.m_container);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    pEVar1 = local_c8;
    *ppEVar3 = local_c8;
    local_b8._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_b8,1);
    local_90._0_4_ = NUMBER;
    local_90._4_4_ = -1;
    local_88 = (PropertyDefinition *)0x0;
    local_80 = -1;
    local_78 = (element_type *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Element::SetProperty(pEVar1,Clip,(Property *)local_b8);
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
    Variant::~Variant((Variant *)local_b8);
    pEVar1 = *ppEVar3;
    local_b8._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_b8,3);
    local_90._0_4_ = KEYWORD;
    local_90._4_4_ = -1;
    local_88 = (PropertyDefinition *)0x0;
    local_80 = -1;
    local_78 = (element_type *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Element::SetProperty(pEVar1,Drag,(Property *)local_b8);
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
    Variant::~Variant((Variant *)local_b8);
    this_00 = (WidgetScroll *)operator_new(0x60);
    WidgetScroll::WidgetScroll(this_00,*ppEVar3);
    local_b8._0_8_ = (pointer)0x0;
    ::std::__uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::reset
              ((__uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_> *)
               &this->scrollbars[orientation].widget,this_00);
    ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::~unique_ptr
              ((unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_> *)local_b8);
    WidgetScroll::Initialise
              (this->scrollbars[orientation].widget._M_t.
               super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
               _M_t.
               super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>.
               super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl,
               HORIZONTAL - (orientation == VERTICAL));
    local_c0._M_head_impl = local_c8;
    local_c8 = (Element *)0x0;
    pEVar1 = Element::AppendChild(this->element,(ElementPtr *)&local_c0,false);
    if (local_c0._M_head_impl != (Element *)0x0) {
      (*((local_c0._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
    }
    local_c0._M_head_impl = (Element *)0x0;
    UpdateScrollElementProperties(this,pEVar1);
    if (local_c8 != (Element *)0x0) {
      (**(code **)(*(long *)local_c8 + 0x10))();
    }
  }
  return true;
}

Assistant:

bool ElementScroll::CreateScrollbar(Orientation orientation)
{
	if (scrollbars[orientation].element && scrollbars[orientation].widget)
		return true;

	ElementPtr scrollbar_element =
		Factory::InstanceElement(element, "*", orientation == VERTICAL ? "scrollbarvertical" : "scrollbarhorizontal", XMLAttributes());
	scrollbars[orientation].element = scrollbar_element.get();
	scrollbars[orientation].element->SetProperty(PropertyId::Clip, Property(1, Unit::NUMBER));
	scrollbars[orientation].element->SetProperty(PropertyId::Drag, Property(Style::Drag::Block));

	scrollbars[orientation].widget = MakeUnique<WidgetScroll>(scrollbars[orientation].element);
	scrollbars[orientation].widget->Initialise(orientation == VERTICAL ? WidgetScroll::VERTICAL : WidgetScroll::HORIZONTAL);

	Element* child = element->AppendChild(std::move(scrollbar_element), false);

	UpdateScrollElementProperties(child);

	return true;
}